

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

realtype N_VWL2Norm_Serial(N_Vector x,N_Vector w)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  realtype rVar5;
  
  lVar1 = (long)*x->content;
  if (lVar1 < 1) {
    rVar5 = 0.0;
  }
  else {
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar4 = *(double *)(*(long *)((long)x->content + 8) + lVar2 * 8) *
              *(double *)(*(long *)((long)w->content + 8) + lVar2 * 8);
      dVar3 = dVar3 + dVar4 * dVar4;
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
    rVar5 = 0.0;
    if (0.0 < dVar3) {
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
        return dVar3;
      }
      rVar5 = SQRT(dVar3);
    }
  }
  return rVar5;
}

Assistant:

realtype N_VWL2Norm_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  realtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++) {
    prodi = xd[i]*wd[i];
    sum += SUNSQR(prodi);
  }

  return(SUNRsqrt(sum));
}